

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uhitm.c
# Opt level: O0

void stumble_onto_mimic(monst *mtmp,schar dx,schar dy)

{
  boolean bVar1;
  char *local_30;
  char *what;
  char *generic;
  char *fmt;
  schar dy_local;
  schar dx_local;
  monst *mtmp_local;
  
  generic = "Wait!  That\'s %s!";
  local_30 = (char *)0x0;
  if (((u.ustuck == (monst *)0x0) && ((*(uint *)&mtmp->field_0x60 >> 0x10 & 1) == 0)) &&
     (bVar1 = dmgtype(mtmp->data,0x13), bVar1 != '\0')) {
    u.ustuck = mtmp;
  }
  if ((((u.uprops[0x1e].intrinsic == 0) && ((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)))) &&
      (((youmonst.data)->mflags1 & 0x1000) == 0)) ||
     ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) {
    if ((((undefined1  [12])level->locations[(int)u.ux + (int)dx][(int)u.uy + (int)dy] &
         (undefined1  [12])0x3f) == (undefined1  [12])0x1c) ||
       (((undefined1  [12])level->locations[(int)u.ux + (int)dx][(int)u.uy + (int)dy] &
        (undefined1  [12])0x3f) == (undefined1  [12])0x1b)) {
      generic = "The door actually was %s!";
    }
    else if ((*(uint *)(level->locations[(int)u.ux + (int)dx] + ((int)u.uy + (int)dy)) >> 0xb &
             0x3ff) == 0x1f0) {
      generic = "That gold was %s!";
    }
    if (((((*(uint *)&mtmp->field_0x60 >> 1 & 1) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
        (u.uprops[0xc].extrinsic != 0)) || (((youmonst.data)->mflags1 & 0x1000000) != 0)) {
      local_30 = a_monnam(mtmp);
    }
    else {
      local_30 = "a monster";
    }
  }
  else if ((((u.uprops[0x19].intrinsic == 0) && (u.uprops[0x19].extrinsic == 0)) &&
           ((youmonst.data != mons + 0x1e &&
            ((youmonst.data != mons + 0x31 && (youmonst.data != mons + 0x32)))))) ||
          (u.uprops[0x19].blocked != 0)) {
    local_30 = "a monster";
  }
  else if (mtmp->m_ap_type == '\x03') {
    local_30 = a_monnam(mtmp);
  }
  if (local_30 != (char *)0x0) {
    pline(generic,local_30);
  }
  wakeup(mtmp);
  return;
}

Assistant:

void stumble_onto_mimic(struct monst *mtmp, schar dx, schar dy)
{
	const char *fmt = "Wait!  That's %s!",
		   *generic = "a monster",
		   *what = 0;

	if (!u.ustuck && !mtmp->mflee && dmgtype(mtmp->data,AD_STCK))
	    u.ustuck = mtmp;

	if (Blind) {
	    if (!Blind_telepat)
		what = generic;		/* with default fmt */
	    else if (mtmp->m_ap_type == M_AP_MONSTER)
		what = a_monnam(mtmp);	/* differs from what was sensed */
	} else {
	    if (level->locations[u.ux+dx][u.uy+dy].mem_bg == S_hcdoor ||
		level->locations[u.ux+dx][u.uy+dy].mem_bg == S_vcdoor)
		fmt = "The door actually was %s!";
	    else if (level->locations[u.ux+dx][u.uy+dy].mem_obj - 1 == GOLD_PIECE)
		fmt = "That gold was %s!";

	    /* cloned Wiz starts out mimicking some other monster and
	       might make himself invisible before being revealed */
	    if (mtmp->minvis && !See_invisible)
		what = generic;
	    else
		what = a_monnam(mtmp);
	}
	if (what) pline(fmt, what);

	wakeup(mtmp);	/* clears mimicking */
}